

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFContext.cpp
# Opt level: O0

void dumpStringOffsetsSection
               (raw_ostream *OS,StringRef SectionName,DWARFObject *Obj,
               DWARFSection *StringOffsetsSection,StringRef StringSection,unit_iterator_range Units,
               bool LittleEndian,uint MaxVersion)

{
  unit_iterator_range Units_00;
  uint32_t uVar1;
  raw_ostream *prVar2;
  char **Vals;
  format_object<const_char_*> local_130;
  char *local_118;
  char *S;
  ulong local_f8;
  uint64_t StringOffset;
  char *local_d8;
  size_t local_d0;
  undefined1 local_c8 [8];
  DataExtractor StrData;
  ulong local_a0;
  uint64_t size;
  uint64_t offset;
  size_t local_88;
  undefined1 local_80 [8];
  DataExtractor strOffsetExt;
  unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *local_60;
  bool LittleEndian_local;
  DWARFSection *StringOffsetsSection_local;
  DWARFObject *Obj_local;
  raw_ostream *OS_local;
  StringRef SectionName_local;
  
  if (MaxVersion < 5) {
    offset = (uint64_t)(StringOffsetsSection->Data).Data;
    local_88 = (StringOffsetsSection->Data).Length;
    llvm::DataExtractor::DataExtractor
              ((DataExtractor *)local_80,StringOffsetsSection->Data,LittleEndian,'\0');
    size = 0;
    local_a0 = llvm::StringRef::size(&StringOffsetsSection->Data);
    if ((local_a0 & 3) != 0) {
      prVar2 = llvm::raw_ostream::operator<<(OS,"error: size of .");
      StrData._16_8_ = SectionName.Data;
      prVar2 = llvm::raw_ostream::operator<<(prVar2,SectionName);
      prVar2 = llvm::raw_ostream::operator<<(prVar2," is not a multiple of ");
      prVar2 = llvm::raw_ostream::operator<<(prVar2,4);
      llvm::raw_ostream::operator<<(prVar2,".\n");
      local_a0 = local_a0 & 0xfffffffffffffffc;
    }
    local_d8 = StringSection.Data;
    local_d0 = StringSection.Length;
    Vals = (char **)(ulong)LittleEndian;
    llvm::DataExtractor::DataExtractor((DataExtractor *)local_c8,StringSection,LittleEndian,'\0');
    while (size < local_a0) {
      llvm::format<unsigned_long>((format_object<unsigned_long> *)&StringOffset,"0x%8.8lx: ",&size);
      llvm::raw_ostream::operator<<(OS,(format_object_base *)&StringOffset);
      uVar1 = llvm::DataExtractor::getU32((DataExtractor *)local_80,&size,(Error *)0x0);
      local_f8 = (ulong)uVar1;
      llvm::format<unsigned_long>((format_object<unsigned_long> *)&S,"%8.8lx  ",&local_f8);
      llvm::raw_ostream::operator<<(OS,(format_object_base *)&S);
      local_118 = llvm::DataExtractor::getCStr((DataExtractor *)local_c8,&local_f8);
      if (local_118 != (char *)0x0) {
        llvm::format<char_const*>(&local_130,(llvm *)"\"%s\"",(char *)&local_118,Vals);
        llvm::raw_ostream::operator<<(OS,&local_130.super_format_object_base);
      }
      llvm::raw_ostream::operator<<(OS,"\n");
    }
  }
  else {
    llvm::iterator_range<std::unique_ptr<llvm::DWARFUnit,std::default_delete<llvm::DWARFUnit>>*>::
    iterator_range<llvm::iterator_range<std::unique_ptr<llvm::DWARFUnit,std::default_delete<llvm::DWARFUnit>>*>&>
              ((iterator_range<std::unique_ptr<llvm::DWARFUnit,std::default_delete<llvm::DWARFUnit>>*>
                *)&strOffsetExt.IsLittleEndian,&Units);
    Units_00.end_iterator = local_60;
    Units_00.begin_iterator =
         (unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *)strOffsetExt._16_8_;
    dumpDWARFv5StringOffsetsSection
              (OS,SectionName,Obj,StringOffsetsSection,StringSection,Units_00,LittleEndian);
  }
  return;
}

Assistant:

static void dumpStringOffsetsSection(raw_ostream &OS, StringRef SectionName,
                                     const DWARFObject &Obj,
                                     const DWARFSection &StringOffsetsSection,
                                     StringRef StringSection,
                                     DWARFContext::unit_iterator_range Units,
                                     bool LittleEndian, unsigned MaxVersion) {
  // If we have at least one (compile or type) unit with DWARF v5 or greater,
  // we assume that the section is formatted like a DWARF v5 string offsets
  // section.
  if (MaxVersion >= 5)
    dumpDWARFv5StringOffsetsSection(OS, SectionName, Obj, StringOffsetsSection,
                                    StringSection, Units, LittleEndian);
  else {
    DataExtractor strOffsetExt(StringOffsetsSection.Data, LittleEndian, 0);
    uint64_t offset = 0;
    uint64_t size = StringOffsetsSection.Data.size();
    // Ensure that size is a multiple of the size of an entry.
    if (size & ((uint64_t)(sizeof(uint32_t) - 1))) {
      OS << "error: size of ." << SectionName << " is not a multiple of "
         << sizeof(uint32_t) << ".\n";
      size &= -(uint64_t)sizeof(uint32_t);
    }
    DataExtractor StrData(StringSection, LittleEndian, 0);
    while (offset < size) {
      OS << format("0x%8.8" PRIx64 ": ", offset);
      uint64_t StringOffset = strOffsetExt.getU32(&offset);
      OS << format("%8.8" PRIx64 "  ", StringOffset);
      const char *S = StrData.getCStr(&StringOffset);
      if (S)
        OS << format("\"%s\"", S);
      OS << "\n";
    }
  }
}